

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O0

bool __thiscall
HighsDomain::ConflictSet::explainInfeasibilityLeq
          (ConflictSet *this,HighsInt *inds,double *vals,HighsInt len,double rhs,double minAct)

{
  double globalbound;
  HighsCDouble M;
  pointer pHVar1;
  reference pvVar2;
  int64_t iVar3;
  double *pdVar4;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  double in_XMM0_Qa;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  double Mlower;
  double ub;
  double lb;
  ResolveCandidate cand;
  HighsInt col;
  HighsInt i;
  HighsNodeQueue *nodequeue;
  ConflictSet *in_stack_000000c8;
  HighsInt infeasible_pos;
  undefined4 in_stack_fffffffffffffef8;
  HighsInt in_stack_fffffffffffffefc;
  HighsNodeQueue *in_stack_ffffffffffffff00;
  double dVar5;
  __normal_iterator<HighsDomain::ConflictSet::ResolveCandidate_*,_std::vector<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>_>
  in_stack_ffffffffffffff08;
  __normal_iterator<HighsDomain::ConflictSet::ResolveCandidate_*,_std::vector<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>_>
  in_stack_ffffffffffffff10;
  double in_stack_ffffffffffffff18;
  HighsInt col_00;
  HighsDomain *in_stack_ffffffffffffff20;
  size_type in_stack_ffffffffffffff28;
  vector<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
  *in_stack_ffffffffffffff30;
  double bound;
  HighsCDouble local_b8;
  double local_a8;
  double local_a0;
  double local_98;
  ResolveCandidate *local_90;
  ResolveCandidate *local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  HighsNodeQueue *local_48;
  undefined4 local_3c;
  double local_38;
  double local_30;
  int local_24;
  long local_20;
  long local_18;
  bool local_1;
  
  local_38 = (double)CONCAT44(in_XMM1_Db,in_XMM1_Da);
  if ((local_38 != -INFINITY) || (NAN(local_38))) {
    local_3c = 0x7fffffff;
    if ((*(byte *)(*in_RDI + 0x280) & 1) != 0) {
      local_3c = *(undefined4 *)(*in_RDI + 0x28c);
    }
    local_30 = in_XMM0_Qa;
    local_24 = in_ECX;
    local_20 = in_RDX;
    local_18 = in_RSI;
    std::
    vector<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
    ::reserve(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    std::
    vector<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
    ::clear((vector<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
             *)0x5cf016);
    pHVar1 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x5cf031);
    local_48 = &pHVar1->nodequeue;
    for (local_4c = 0; local_4c < local_24; local_4c = local_4c + 1) {
      local_50 = *(int *)(local_18 + (long)local_4c * 4);
      local_54 = local_4c;
      col_00 = (HighsInt)((ulong)in_stack_ffffffffffffff18 >> 0x20);
      if (*(double *)(local_20 + (long)local_4c * 8) <= 0.0) {
        local_80 = getColUpperPos(in_stack_ffffffffffffff20,col_00,
                                  SUB84(in_stack_ffffffffffffff18,0),
                                  (HighsInt *)in_stack_ffffffffffffff10._M_current);
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI[1] + 800),
                            (long)local_50);
        local_68 = *pvVar2;
        if ((local_80 < local_68) && (local_58 != -1)) {
          local_70 = *(double *)(local_20 + (long)local_4c * 8) * (local_80 - local_68);
          in_stack_ffffffffffffff10._M_current =
               *(ResolveCandidate **)(local_20 + (long)local_4c * 8);
          in_stack_ffffffffffffff18 = local_80;
          pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI[1] + 800),
                              (long)local_50);
          in_stack_ffffffffffffff20 = (HighsDomain *)*pvVar2;
          iVar3 = HighsNodeQueue::numNodesDown(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
          local_60 = computePrio((double)in_stack_ffffffffffffff10._M_current,
                                 in_stack_ffffffffffffff18,(double)in_stack_ffffffffffffff20,iVar3);
          goto LAB_005cf323;
        }
      }
      else {
        local_78 = getColLowerPos(in_stack_ffffffffffffff20,col_00,
                                  SUB84(in_stack_ffffffffffffff18,0),
                                  (HighsInt *)in_stack_ffffffffffffff10._M_current);
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI[1] + 0x308),
                            (long)local_50);
        local_68 = *pvVar2;
        if ((local_68 < local_78) && (local_58 != -1)) {
          local_70 = *(double *)(local_20 + (long)local_4c * 8) * (local_78 - local_68);
          dVar5 = *(double *)(local_20 + (long)local_4c * 8);
          bound = local_78;
          pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI[1] + 0x308),
                              (long)local_50);
          globalbound = *pvVar2;
          iVar3 = HighsNodeQueue::numNodesUp(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
          local_60 = computePrio(dVar5,bound,globalbound,iVar3);
LAB_005cf323:
          std::
          vector<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
          ::push_back((vector<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
                       *)in_stack_ffffffffffffff10._M_current,in_stack_ffffffffffffff08._M_current);
        }
      }
    }
    local_88 = (ResolveCandidate *)
               std::
               vector<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
               ::begin((vector<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
                        *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    local_90 = (ResolveCandidate *)
               std::
               vector<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
               ::end((vector<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
                      *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    pdqsort<__gnu_cxx::__normal_iterator<HighsDomain::ConflictSet::ResolveCandidate*,std::vector<HighsDomain::ConflictSet::ResolveCandidate,std::allocator<HighsDomain::ConflictSet::ResolveCandidate>>>>
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    local_a0 = 10.0;
    local_a8 = ABS(local_30);
    pdVar4 = std::max<double>(&local_a0,&local_a8);
    dVar5 = *pdVar4;
    pHVar1 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x5cf401);
    local_98 = dVar5 * pHVar1->feastol + local_30;
    HighsCDouble::HighsCDouble(&local_b8,local_38);
    M.lo = rhs;
    M.hi = minAct;
    local_1 = resolveLinearLeq(in_stack_000000c8,M,(double)nodequeue,_col);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool HighsDomain::ConflictSet::explainInfeasibilityLeq(const HighsInt* inds,
                                                       const double* vals,
                                                       HighsInt len, double rhs,
                                                       double minAct) {
  if (minAct == -kHighsInf) return false;

  HighsInt infeasible_pos = kHighsIInf;
  if (localdom.infeasible_) infeasible_pos = localdom.infeasible_pos;

  resolveBuffer.reserve(len);
  resolveBuffer.clear();
  const auto& nodequeue = localdom.mipsolver->mipdata_->nodequeue;
  for (HighsInt i = 0; i < len; ++i) {
    HighsInt col = inds[i];

    ResolveCandidate cand;
    cand.valuePos = i;

    if (vals[i] > 0) {
      double lb = localdom.getColLowerPos(col, infeasible_pos, cand.boundPos);
      cand.baseBound = globaldom.col_lower_[col];
      if (cand.baseBound >= lb || cand.boundPos == -1) continue;
      cand.delta = vals[i] * (lb - cand.baseBound);
      cand.prio = computePrio(vals[i], lb, globaldom.col_lower_[col],
                              nodequeue.numNodesUp(col));
    } else {
      double ub = localdom.getColUpperPos(col, infeasible_pos, cand.boundPos);
      cand.baseBound = globaldom.col_upper_[col];
      if (cand.baseBound <= ub || cand.boundPos == -1) continue;
      cand.delta = vals[i] * (ub - cand.baseBound);
      cand.prio = computePrio(vals[i], ub, globaldom.col_upper_[col],
                              nodequeue.numNodesDown(col));
    }

    resolveBuffer.push_back(cand);
  }

  pdqsort(resolveBuffer.begin(), resolveBuffer.end());

  // compute the lower bound of M that is necessary
  double Mlower = rhs + std::max(10.0, std::fabs(rhs)) *
                            localdom.mipsolver->mipdata_->feastol;

  return resolveLinearLeq(minAct, Mlower, vals);
}